

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TomlProcessingFunctions.hpp
# Opt level: O1

void helics::fileops::replaceIfMember<bool>(value *element,string *key,bool *loc)

{
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *v;
  boolean_type *pbVar1;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> val;
  value uval;
  basic_value<toml::type_config> local_1b0;
  basic_value<toml::type_config> local_e8;
  
  toml::basic_value<toml::type_config>::basic_value(&local_e8);
  v = toml::find_or<toml::type_config,std::__cxx11::string>(element,key,&local_e8);
  toml::basic_value<toml::type_config>::basic_value(&local_1b0,v);
  if (local_1b0.type_ != empty) {
    pbVar1 = toml::basic_value<toml::type_config>::as_boolean(&local_1b0);
    *loc = *pbVar1;
  }
  toml::basic_value<toml::type_config>::cleanup(&local_1b0,(EVP_PKEY_CTX *)v);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1b0.comments_);
  toml::detail::region::~region(&local_1b0.region_);
  toml::basic_value<toml::type_config>::cleanup(&local_e8,(EVP_PKEY_CTX *)v);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_e8.comments_);
  toml::detail::region::~region(&local_e8.region_);
  return;
}

Assistant:

inline void replaceIfMember(const toml::value& element, const std::string& key, X& loc)
{
    toml::value uval;
    auto val = toml::find_or(element, key, uval);

    if (!val.is_empty()) {
        loc = toml::get<X>(val);
    }
}